

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void refresh_reference_frames(AV1_COMP *cpi)

{
  int iVar1;
  long *in_RDI;
  int ref_frame;
  int refresh_all_bufs;
  int num_ref_buffers;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_14;
  
  local_14 = 8;
  iVar1 = reduce_num_ref_buffers
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 != 0) {
    if (*(char *)(*in_RDI + 0x190a + (ulong)*(byte *)(in_RDI + 0xe258)) != '\0') {
      frame_is_sframe((AV1_COMMON *)(in_RDI + 0x77f0));
    }
    local_14 = 7;
  }
  for (iVar1 = 0; iVar1 < local_14; iVar1 = iVar1 + 1) {
    if ((*(int *)((long)in_RDI + 0x3bfa4) >> ((byte)iVar1 & 0x1f) & 1U) == 1) {
      assign_frame_buffer_p
                ((RefCntBuffer **)(in_RDI + (long)iVar1 + 0x7824),(RefCntBuffer *)in_RDI[0x780d]);
    }
  }
  return;
}

Assistant:

static inline void refresh_reference_frames(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  // All buffers are refreshed for shown keyframes and S-frames.
  // In case of RT, golden frame refreshes the 6th slot and other reference
  // frames refresh slots 0 to 5. Slot 7 is not refreshed by any reference
  // frame. Thus, only 7 buffers are refreshed for keyframes and S-frames
  // instead of 8.
  int num_ref_buffers = REF_FRAMES;
  if (reduce_num_ref_buffers(cpi)) {
    const int refresh_all_bufs =
        (cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET ||
         frame_is_sframe(cm));
    assert(IMPLIES(((cm->current_frame.refresh_frame_flags >> 7) & 1) == 1,
                   refresh_all_bufs));
    (void)refresh_all_bufs;
    num_ref_buffers--;
  }

  for (int ref_frame = 0; ref_frame < num_ref_buffers; ref_frame++) {
    if (((cm->current_frame.refresh_frame_flags >> ref_frame) & 1) == 1) {
      assign_frame_buffer_p(&cm->ref_frame_map[ref_frame], cm->cur_frame);
    }
  }
}